

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_ssse3_intr.c
# Opt level: O1

void ihevc_itrans_recon_4x4_ttype1_ssse3
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar13;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar14 [16];
  short sVar21;
  short sVar22;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar23 [16];
  short sVar30;
  int iVar31;
  int iVar42;
  int iVar43;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  int iVar44;
  undefined1 auVar41 [16];
  int iVar45;
  int iVar56;
  int iVar57;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  int iVar58;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [12];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar77 [12];
  undefined1 auVar82 [16];
  int iVar89;
  int iVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar92 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  lVar9 = (long)dst_strd;
  uVar2 = *(ulong *)pi2_src;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar2;
  lVar10 = (long)src_strd;
  uVar3 = *(ulong *)(pi2_src + lVar10);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar3;
  puVar1 = (ulong *)((long)(pi2_src + lVar10) + lVar10 * 2);
  uVar4 = *puVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar4;
  uVar5 = *(ulong *)((long)puVar1 + lVar10 * 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar5;
  auVar11 = psraw(auVar59,0xf);
  auVar14 = psraw(auVar46,0xf);
  auVar23 = psraw(auVar32,0xf);
  auVar67 = psraw(auVar12,0xf);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar2;
  auVar62._12_2_ = (short)(uVar2 >> 0x30);
  auVar62._14_2_ = auVar11._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar2;
  auVar61._10_2_ = auVar11._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = (short)(uVar2 >> 0x20);
  auVar60._0_8_ = uVar2;
  auVar6._4_8_ = auVar60._8_8_;
  auVar6._2_2_ = auVar11._2_2_;
  auVar6._0_2_ = (short)(uVar2 >> 0x10);
  iVar58 = CONCAT22(auVar11._0_2_,(short)uVar2);
  auVar50._8_4_ = 0;
  auVar50._0_8_ = uVar3;
  auVar50._12_2_ = (short)(uVar3 >> 0x30);
  auVar50._14_2_ = auVar14._6_2_;
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._8_2_ = 0;
  auVar49._0_8_ = uVar3;
  auVar49._10_2_ = auVar14._4_2_;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._8_2_ = (short)(uVar3 >> 0x20);
  auVar48._0_8_ = uVar3;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47._6_2_ = auVar14._2_2_;
  auVar47._4_2_ = (short)(uVar3 >> 0x10);
  auVar47._0_2_ = (undefined2)uVar3;
  auVar47._2_2_ = auVar14._0_2_;
  auVar33._8_4_ = 0;
  auVar33._0_8_ = uVar4;
  auVar33._12_2_ = (short)(uVar4 >> 0x30);
  auVar33._14_2_ = auVar23._6_2_;
  auVar92._12_4_ = auVar33._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar4;
  auVar92._10_2_ = auVar23._4_2_;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = (short)(uVar4 >> 0x20);
  auVar91._0_8_ = uVar4;
  auVar7._4_8_ = auVar91._8_8_;
  auVar7._2_2_ = auVar23._2_2_;
  auVar7._0_2_ = (short)(uVar4 >> 0x10);
  iVar45 = CONCAT22(auVar23._0_2_,(short)uVar4);
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar5;
  auVar51._12_2_ = (short)(uVar5 >> 0x30);
  auVar51._14_2_ = auVar67._6_2_;
  auVar69._12_4_ = auVar51._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar5;
  auVar69._10_2_ = auVar67._4_2_;
  auVar64._10_6_ = auVar69._10_6_;
  auVar64._8_2_ = (short)(uVar5 >> 0x20);
  auVar64._0_8_ = uVar5;
  auVar8._4_8_ = auVar64._8_8_;
  auVar8._2_2_ = auVar67._2_2_;
  auVar8._0_2_ = (short)(uVar5 >> 0x10);
  auVar35._0_4_ = CONCAT22(auVar67._0_2_,(short)uVar5);
  auVar35._4_12_ = auVar8;
  iVar56 = auVar7._0_4_;
  iVar31 = auVar6._0_4_;
  iVar57 = auVar91._8_4_;
  iVar42 = auVar60._8_4_;
  auVar11 = pmovsxbd(auVar11,0x4a4a4a4a);
  auVar51 = pmulld(auVar47,auVar11);
  auVar83._0_4_ = auVar35._0_4_ + iVar45;
  iVar43 = auVar8._0_4_;
  auVar83._4_4_ = iVar43 + iVar56;
  iVar44 = auVar64._8_4_;
  auVar83._8_4_ = iVar44 + iVar57;
  auVar83._12_4_ = auVar69._12_4_ + auVar92._12_4_;
  auVar34._0_4_ = iVar45 + iVar58;
  auVar34._4_4_ = iVar56 + iVar31;
  auVar34._8_4_ = iVar57 + iVar42;
  auVar34._12_4_ = auVar92._12_4_ + auVar61._12_4_;
  auVar63._0_4_ = iVar58 - auVar35._0_4_;
  auVar63._4_4_ = iVar31 - iVar43;
  auVar63._8_4_ = iVar42 - iVar44;
  auVar63._12_4_ = auVar61._12_4_ - auVar69._12_4_;
  auVar68._0_4_ = (iVar58 - iVar45) + auVar35._0_4_;
  auVar68._4_4_ = (iVar31 - iVar56) + iVar43;
  auVar68._8_4_ = (iVar42 - iVar57) + iVar44;
  auVar68._12_4_ = (auVar61._12_4_ - auVar92._12_4_) + auVar69._12_4_;
  auVar67 = pmovsxbd(auVar35,0x1d1d1d1d);
  auVar78 = pmulld(auVar34,auVar67);
  auVar14 = pmovsxbd(auVar14,0x37373737);
  auVar32 = pmulld(auVar83,auVar14);
  auVar12 = pmovsxbd(auVar23,0xe3e3e3e3);
  auVar23 = pmulld(auVar83,auVar12);
  auVar91 = pmulld(auVar63,auVar14);
  auVar35 = pmulld(auVar34,auVar14);
  auVar64 = pmulld(auVar63,auVar67);
  auVar69 = pmulld(auVar68,auVar11);
  auVar92 = pmovsxbd(in_XMM12,0x40404040);
  iVar31 = auVar92._0_4_;
  iVar45 = auVar51._0_4_ + iVar31;
  iVar42 = auVar92._4_4_;
  iVar56 = auVar51._4_4_ + iVar42;
  iVar43 = auVar92._8_4_;
  iVar57 = auVar51._8_4_ + iVar43;
  iVar44 = auVar92._12_4_;
  iVar58 = auVar51._12_4_ + iVar44;
  auVar79._0_4_ = auVar78._0_4_ + iVar45 + auVar32._0_4_ >> 7;
  auVar79._4_4_ = auVar78._4_4_ + iVar56 + auVar32._4_4_ >> 7;
  auVar79._8_4_ = auVar78._8_4_ + iVar57 + auVar32._8_4_ >> 7;
  auVar79._12_4_ = auVar78._12_4_ + iVar58 + auVar32._12_4_ >> 7;
  auVar52._0_4_ = iVar45 + auVar91._0_4_ + auVar23._0_4_ >> 7;
  auVar52._4_4_ = iVar56 + auVar91._4_4_ + auVar23._4_4_ >> 7;
  auVar52._8_4_ = iVar57 + auVar91._8_4_ + auVar23._8_4_ >> 7;
  auVar52._12_4_ = iVar58 + auVar91._12_4_ + auVar23._12_4_ >> 7;
  auVar23 = packssdw(auVar79,auVar52);
  auVar36._0_4_ = (auVar35._0_4_ - auVar51._0_4_) + auVar64._0_4_ + iVar31 >> 7;
  auVar36._4_4_ = (auVar35._4_4_ - auVar51._4_4_) + auVar64._4_4_ + iVar42 >> 7;
  auVar36._8_4_ = (auVar35._8_4_ - auVar51._8_4_) + auVar64._8_4_ + iVar43 >> 7;
  auVar36._12_4_ = (auVar35._12_4_ - auVar51._12_4_) + auVar64._12_4_ + iVar44 >> 7;
  auVar70._0_4_ = auVar69._0_4_ + iVar31 >> 7;
  auVar70._4_4_ = auVar69._4_4_ + iVar42 >> 7;
  auVar70._8_4_ = auVar69._8_4_ + iVar43 >> 7;
  auVar70._12_4_ = auVar69._12_4_ + iVar44 >> 7;
  auVar69 = packssdw(auVar70,auVar36);
  auVar37._4_4_ = auVar23._8_4_;
  auVar37._0_4_ = auVar23._0_4_;
  auVar37._8_4_ = auVar23._4_4_;
  auVar37._12_4_ = auVar23._12_4_;
  auVar78 = pshufhw(auVar23,auVar37,0xd8);
  auVar35 = pshuflw(auVar37,auVar37,0xd8);
  auVar53._4_4_ = auVar69._8_4_;
  auVar53._0_4_ = auVar69._0_4_;
  auVar53._8_4_ = auVar69._4_4_;
  auVar53._12_4_ = auVar69._12_4_;
  auVar51 = pshufhw(auVar64,auVar53,0xd8);
  auVar76._0_8_ = CONCAT44(auVar51._8_4_,auVar78._8_4_);
  auVar76._8_4_ = auVar78._12_4_;
  auVar80._12_4_ = auVar51._12_4_;
  auVar80._0_12_ = auVar76;
  auVar64 = pshuflw(auVar53,auVar53,0xd8);
  auVar39._0_8_ = auVar35._0_8_;
  auVar39._8_4_ = auVar35._4_4_;
  auVar39._12_4_ = auVar64._4_4_;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._0_8_ = CONCAT44(auVar64._0_4_,auVar35._0_4_);
  auVar69 = psraw(auVar38,0xf);
  auVar23 = psraw(auVar80,0xf);
  auVar74._0_12_ = auVar38._0_12_;
  auVar74._12_2_ = auVar64._2_2_;
  auVar74._14_2_ = auVar69._6_2_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = auVar38._0_10_;
  auVar73._10_2_ = auVar69._4_2_;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = auVar64._0_2_;
  auVar72._0_8_ = auVar38._0_8_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = auVar69._2_2_;
  auVar71._4_2_ = auVar35._2_2_;
  auVar71._0_4_ = auVar35._0_4_;
  iVar57 = CONCAT22(auVar69._0_2_,auVar35._0_2_);
  auVar87._12_2_ = auVar51._10_2_;
  auVar87._0_12_ = auVar76;
  auVar87._14_2_ = auVar23._6_2_;
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._0_10_ = auVar76._0_10_;
  auVar86._10_2_ = auVar23._4_2_;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = auVar51._8_2_;
  auVar85._0_8_ = auVar76._0_8_;
  auVar84._8_8_ = auVar85._8_8_;
  auVar84._6_2_ = auVar23._2_2_;
  auVar84._4_2_ = auVar78._10_2_;
  auVar84._0_4_ = auVar78._8_4_;
  iVar44 = CONCAT22(auVar23._0_2_,auVar78._8_2_);
  auVar40._2_2_ = auVar69._8_2_;
  auVar40._0_2_ = auVar35._4_2_;
  auVar40._4_2_ = auVar35._6_2_;
  auVar40._6_2_ = auVar69._10_2_;
  auVar40._8_2_ = auVar64._4_2_;
  auVar40._10_2_ = auVar69._12_2_;
  auVar40._12_2_ = auVar64._6_2_;
  auVar40._14_2_ = auVar69._14_2_;
  iVar58 = CONCAT22(auVar23._8_2_,auVar78._12_2_);
  auVar77._0_8_ = CONCAT26(auVar23._10_2_,CONCAT24(auVar78._14_2_,iVar58));
  auVar77._8_2_ = auVar51._12_2_;
  auVar77._10_2_ = auVar23._12_2_;
  auVar81._12_2_ = auVar51._14_2_;
  auVar81._0_12_ = auVar77;
  auVar81._14_2_ = auVar23._14_2_;
  iVar45 = auVar71._4_4_;
  iVar89 = auVar84._4_4_;
  iVar56 = auVar72._8_4_;
  iVar90 = auVar85._8_4_;
  auVar35 = pmulld(auVar40,auVar11);
  auVar65._0_4_ = iVar57 + iVar44;
  auVar65._4_4_ = iVar45 + iVar89;
  auVar65._8_4_ = iVar56 + iVar90;
  auVar65._12_4_ = auVar73._12_4_ + auVar86._12_4_;
  auVar88._0_4_ = iVar44 + iVar58;
  iVar31 = (int)((ulong)auVar77._0_8_ >> 0x20);
  auVar88._4_4_ = iVar89 + iVar31;
  iVar42 = auVar77._8_4_;
  auVar88._8_4_ = iVar90 + iVar42;
  iVar43 = auVar81._12_4_;
  auVar88._12_4_ = auVar86._12_4_ + iVar43;
  auVar75._0_4_ = iVar57 - iVar58;
  auVar75._4_4_ = iVar45 - iVar31;
  auVar75._8_4_ = iVar56 - iVar42;
  auVar75._12_4_ = auVar73._12_4_ - iVar43;
  auVar54._0_4_ = (iVar57 - iVar44) + iVar58;
  auVar54._4_4_ = (iVar45 - iVar89) + iVar31;
  auVar54._8_4_ = (iVar56 - iVar90) + iVar42;
  auVar54._12_4_ = (auVar73._12_4_ - auVar86._12_4_) + iVar43;
  auVar51 = pmulld(auVar65,auVar67);
  auVar69 = pmulld(auVar88,auVar14);
  auVar64 = pmulld(auVar88,auVar12);
  auVar12 = pmulld(auVar75,auVar14);
  auVar78._0_4_ = auVar12._0_4_ + auVar64._0_4_;
  auVar78._4_4_ = auVar12._4_4_ + auVar64._4_4_;
  auVar78._8_4_ = auVar12._8_4_ + auVar64._8_4_;
  auVar78._12_4_ = auVar12._12_4_ + auVar64._12_4_;
  auVar12 = pmulld(auVar65,auVar14);
  auVar64 = pmulld(auVar75,auVar67);
  auVar14 = pmulld(auVar54,auVar11);
  auVar11 = pmovsxwd(auVar11,0x800080008000800);
  iVar45 = auVar11._0_4_;
  iVar31 = auVar35._0_4_ + iVar45;
  iVar56 = auVar11._4_4_;
  iVar42 = auVar35._4_4_ + iVar56;
  iVar57 = auVar11._8_4_;
  iVar43 = auVar35._8_4_ + iVar57;
  iVar58 = auVar11._12_4_;
  iVar44 = auVar35._12_4_ + iVar58;
  auVar82._0_4_ = auVar69._0_4_ + auVar51._0_4_ + iVar31 >> 0xc;
  auVar82._4_4_ = auVar69._4_4_ + auVar51._4_4_ + iVar42 >> 0xc;
  auVar82._8_4_ = auVar69._8_4_ + auVar51._8_4_ + iVar43 >> 0xc;
  auVar82._12_4_ = auVar69._12_4_ + auVar51._12_4_ + iVar44 >> 0xc;
  auVar41._0_4_ = iVar31 + auVar78._0_4_ >> 0xc;
  auVar41._4_4_ = iVar42 + auVar78._4_4_ >> 0xc;
  auVar41._8_4_ = iVar43 + auVar78._8_4_ >> 0xc;
  auVar41._12_4_ = iVar44 + auVar78._12_4_ >> 0xc;
  auVar69 = packssdw(auVar82,auVar41);
  auVar66._0_4_ = auVar12._0_4_ + iVar45 + (auVar64._0_4_ - auVar35._0_4_) >> 0xc;
  auVar66._4_4_ = auVar12._4_4_ + iVar56 + (auVar64._4_4_ - auVar35._4_4_) >> 0xc;
  auVar66._8_4_ = auVar12._8_4_ + iVar57 + (auVar64._8_4_ - auVar35._8_4_) >> 0xc;
  auVar66._12_4_ = auVar12._12_4_ + iVar58 + (auVar64._12_4_ - auVar35._12_4_) >> 0xc;
  auVar55._0_4_ = auVar14._0_4_ + iVar45 >> 0xc;
  auVar55._4_4_ = auVar14._4_4_ + iVar56 >> 0xc;
  auVar55._8_4_ = auVar14._8_4_ + iVar57 >> 0xc;
  auVar55._12_4_ = auVar14._12_4_ + iVar58 >> 0xc;
  auVar14 = packssdw(auVar55,auVar66);
  auVar11._4_4_ = auVar69._8_4_;
  auVar11._0_4_ = auVar69._0_4_;
  auVar11._8_4_ = auVar69._4_4_;
  auVar11._12_4_ = auVar69._12_4_;
  auVar12 = pshufhw(auVar67,auVar11,0xd8);
  auVar11 = pshuflw(auVar11,auVar11,0xd8);
  auVar23._4_4_ = auVar14._8_4_;
  auVar23._0_4_ = auVar14._0_4_;
  auVar23._8_4_ = auVar14._4_4_;
  auVar23._12_4_ = auVar14._12_4_;
  auVar64 = pshufhw(auVar78,auVar23,0xd8);
  auVar35 = pshuflw(auVar23,auVar23,0xd8);
  auVar14._0_8_ = auVar11._0_8_;
  auVar14._8_4_ = auVar11._4_4_;
  auVar14._12_4_ = auVar35._4_4_;
  auVar67._8_8_ = auVar14._8_8_;
  auVar67._0_4_ = auVar11._0_4_;
  auVar67._4_4_ = auVar35._0_4_;
  lVar10 = (long)pred_strd;
  auVar14 = pmovzxbw(auVar35,*(undefined8 *)pu1_pred);
  auVar69 = pmovzxbw(auVar64,*(undefined8 *)(pu1_pred + lVar10));
  auVar51 = pmovzxbw(auVar69,*(undefined8 *)(pu1_pred + lVar10 * 2));
  sVar13 = auVar14._0_2_ + auVar11._0_2_;
  sVar15 = auVar14._2_2_ + auVar11._2_2_;
  sVar16 = auVar14._4_2_ + auVar35._0_2_;
  sVar17 = auVar14._6_2_ + auVar35._2_2_;
  sVar18 = auVar69._0_2_ + auVar11._4_2_;
  sVar19 = auVar69._2_2_ + auVar11._6_2_;
  sVar20 = auVar69._4_2_ + auVar35._4_2_;
  sVar21 = auVar69._6_2_ + auVar35._6_2_;
  auVar11 = pmovzxbw(auVar67,*(undefined8 *)(pu1_pred + lVar10 * 3));
  sVar22 = auVar51._0_2_ + auVar12._8_2_;
  sVar24 = auVar51._2_2_ + auVar12._10_2_;
  sVar25 = auVar51._4_2_ + auVar64._8_2_;
  sVar26 = auVar51._6_2_ + auVar64._10_2_;
  sVar27 = auVar11._0_2_ + auVar12._12_2_;
  sVar28 = auVar11._2_2_ + auVar12._14_2_;
  sVar29 = auVar11._4_2_ + auVar64._12_2_;
  sVar30 = auVar11._6_2_ + auVar64._14_2_;
  *pu1_dst = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
  pu1_dst[1] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
  pu1_dst[2] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
  pu1_dst[3] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
  pu1_dst[lVar9 + 4] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
  pu1_dst[lVar9 + 5] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
  pu1_dst[lVar9 + 6] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
  pu1_dst[lVar9 + 7] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
  lVar10 = lVar9 * 2;
  pu1_dst[lVar10 + 8] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
  pu1_dst[lVar10 + 9] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
  pu1_dst[lVar10 + 10] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
  pu1_dst[lVar10 + 0xb] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
  lVar9 = lVar9 * 3;
  pu1_dst[lVar9 + 0xc] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
  pu1_dst[lVar9 + 0xd] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
  pu1_dst[lVar9 + 0xe] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
  pu1_dst[lVar9 + 0xf] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_ttype1_ssse3(WORD16 *pi2_src,
                                         WORD16 *pi2_tmp,
                                         UWORD8 *pu1_pred,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 pred_strd,
                                         WORD32 dst_strd,
                                         WORD32 zero_cols,
                                         WORD32 zero_rows)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_32;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_temp_reg_35;
    __m128i m_temp_reg_36;
    __m128i m_rdng_factor;
    __m128i m_count;

    __m128i m_ge_zero16b_flag_row0;
    __m128i m_ge_zero16b_flag_row1;
    __m128i m_ge_zero16b_flag_row2;
    __m128i m_ge_zero16b_flag_row3;

    __m128i m_zero = _mm_setzero_si128();

    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_cols);
    UNUSED(zero_rows);
    UNUSED(pi2_tmp);
    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_ge_zero16b_flag_row0 = _mm_cmpgt_epi16(m_zero, m_temp_reg_0);
    m_ge_zero16b_flag_row1 = _mm_cmpgt_epi16(m_zero, m_temp_reg_1);
    m_ge_zero16b_flag_row2 = _mm_cmpgt_epi16(m_zero, m_temp_reg_2);
    m_ge_zero16b_flag_row3 = _mm_cmpgt_epi16(m_zero, m_temp_reg_3);

    m_temp_reg_0 = _mm_unpacklo_epi16(m_temp_reg_0, m_ge_zero16b_flag_row0);
    m_temp_reg_1 = _mm_unpacklo_epi16(m_temp_reg_1, m_ge_zero16b_flag_row1);
    m_temp_reg_2 = _mm_unpacklo_epi16(m_temp_reg_2, m_ge_zero16b_flag_row2);
    m_temp_reg_3 = _mm_unpacklo_epi16(m_temp_reg_3, m_ge_zero16b_flag_row3);

    /*m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);*/

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[3] in m_temp_reg_13 */
    {
        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_1, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_1, 3);
        m_temp_reg_22 = _mm_slli_epi32(m_temp_reg_1, 1);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_13 = _mm_add_epi32(m_temp_reg_22, m_temp_reg_23);
        //m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3);
    }

    /* c[0] in m_temp_reg_10 */
    {
        m_temp_reg_10 = _mm_add_epi32(m_temp_reg_0, m_temp_reg_2);
    }

    /* c[1] in m_temp_reg_11 */
    {
        m_temp_reg_11 = _mm_add_epi32(m_temp_reg_2, m_temp_reg_3);
    }

    /* c[2] in m_temp_reg_12 */
    {
        m_temp_reg_12 = _mm_sub_epi32(m_temp_reg_0, m_temp_reg_3);
    }

    /* c[4] in m_temp_reg_14 */
    /* c[4] = src[0] - src[2] + src[3] */
    {
        m_temp_reg_14 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_3);
    }

    /* Stage 1 outputs stored in m_temp_reg_20-23 */
    {
        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_10, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_10, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_10);
        m_temp_reg_30 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_10, m_coeff1);//29*c0

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_11, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_11, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_11);
        m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_11, m_coeff2);//55*c1

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_11, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_11, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_11);
        m_temp_reg_32 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_11, m_coeff1);//29*c1

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_12, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_12, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_12);
        m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_12, m_coeff2);//55*c2

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_10, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_10, 3);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_10);
        m_temp_reg_34 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_10, m_coeff2);//55*c0

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_12, 5);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_12, 1);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_12);
        m_temp_reg_35 = _mm_sub_epi32(m_temp_reg_23, m_temp_reg_21);
        //m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_12, m_coeff1);//29*c2

        m_temp_reg_20 = _mm_slli_epi32(m_temp_reg_14, 6);
        m_temp_reg_21 = _mm_slli_epi32(m_temp_reg_14, 3);
        m_temp_reg_22 = _mm_slli_epi32(m_temp_reg_14, 1);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_36 = _mm_add_epi32(m_temp_reg_22, m_temp_reg_23);
        //m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_14, m_coeff3);//74*c4

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
        m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

        m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
        m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_13);
        m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

        m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_30 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_31 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);

    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        /*m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);
        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);*/

        m_ge_zero16b_flag_row0 = _mm_cmpgt_epi16(m_zero, m_temp_reg_30);
        m_ge_zero16b_flag_row1 = _mm_cmpgt_epi16(m_zero, m_temp_reg_31);

        m_temp_reg_20 = _mm_unpacklo_epi16(m_temp_reg_30, m_ge_zero16b_flag_row0);
        m_temp_reg_21 = _mm_unpacklo_epi16(m_temp_reg_31, m_ge_zero16b_flag_row1);
        m_temp_reg_22 = _mm_unpackhi_epi16(m_temp_reg_30, m_ge_zero16b_flag_row0);
        m_temp_reg_23 = _mm_unpackhi_epi16(m_temp_reg_31, m_ge_zero16b_flag_row1);


        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[3] stored in m_temp_reg_3 */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_22, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_22, 3);
            m_temp_reg_12 = _mm_slli_epi32(m_temp_reg_22, 1);
            m_temp_reg_13 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
            m_temp_reg_3 = _mm_add_epi32(m_temp_reg_12, m_temp_reg_13);
            //m_temp_reg_3 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3);
        }

        /* c[0] stored in m_temp_reg_0 */
        {
            m_temp_reg_0 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_21);
        }

        /* c[1] stored in m_temp_reg_1 */
        {
            m_temp_reg_1 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_21);
        }

        /* c[2] stored in m_temp_reg_2 */
        {
            m_temp_reg_2 = _mm_sub_epi32(m_temp_reg_20, m_temp_reg_23);
        }

        /* c[4] stored in m_temp_reg_4 */
        {
            m_temp_reg_4 = _mm_add_epi32(m_temp_reg_4, m_temp_reg_23);
        }

        /* Stage 2 output generation */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_0, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_0);
            m_temp_reg_30 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_30 = _mm_mullo_epi32(m_temp_reg_0, m_coeff1);//29*c0

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_1, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_1, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_1);
            m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_31 = _mm_mullo_epi32(m_temp_reg_1, m_coeff2);//55*c1

            m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_1, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_1, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_1);
            m_temp_reg_32 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_32 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1);//29*c1

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_2, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_2);
            m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_33 = _mm_mullo_epi32(m_temp_reg_2, m_coeff2);//55*c2

            m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_0, 3);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_0);
            m_temp_reg_34 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_34 = _mm_mullo_epi32(m_temp_reg_0, m_coeff2);//55*c0

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_2, 5);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 1);
            m_temp_reg_13 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_2);
            m_temp_reg_35 = _mm_sub_epi32(m_temp_reg_13, m_temp_reg_11);
            //m_temp_reg_35 = _mm_mullo_epi32(m_temp_reg_2, m_coeff1);//29*c2

            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_4, 6);
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_4, 3);
            m_temp_reg_12 = _mm_slli_epi32(m_temp_reg_4, 1);
            m_temp_reg_13 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
            m_temp_reg_36 = _mm_add_epi32(m_temp_reg_12, m_temp_reg_13);
            //m_temp_reg_36 = _mm_mullo_epi32(m_temp_reg_4, m_coeff3);//74*c4

            m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
            m_count = _mm_cvtsi32_si128(i4_shift);

            m_temp_reg_4 = _mm_add_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_31);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_20, m_temp_reg_4);

            m_temp_reg_21 = _mm_sub_epi32(m_temp_reg_33, m_temp_reg_32);
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_21, m_temp_reg_4);

            m_temp_reg_4 = _mm_sub_epi32(m_rdng_factor, m_temp_reg_3);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_34, m_temp_reg_35);
            m_temp_reg_23 = _mm_add_epi32(m_temp_reg_23, m_temp_reg_4);

            m_temp_reg_22 = _mm_add_epi32(m_temp_reg_36, m_rdng_factor);

            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            WORD32 *pi4_dst = (WORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_unpacklo_epi8(m_temp_reg_0, m_zero);
            m_temp_reg_1 = _mm_unpacklo_epi8(m_temp_reg_1, m_zero);
            m_temp_reg_2 = _mm_unpacklo_epi8(m_temp_reg_2, m_zero);
            m_temp_reg_3 = _mm_unpacklo_epi8(m_temp_reg_3, m_zero);

            /*m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);*/

            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pi4_dst = (WORD32 *)(pu1_dst);

            *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}